

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

VectorStringBuffer * duckdb::StringVector::GetStringBuffer(Vector *vector)

{
  PhysicalType PVar1;
  bool bVar2;
  LogicalType *this;
  undefined8 uVar3;
  VectorStringBuffer *pVVar4;
  Vector *in_RDI;
  LogicalType *in_stack_ffffffffffffff68;
  VectorBuffer *in_stack_ffffffffffffff70;
  shared_ptr<duckdb::VectorStringBuffer,_true> *in_stack_ffffffffffffff78;
  shared_ptr<duckdb::VectorBuffer,_true> *in_stack_ffffffffffffff80;
  VectorBuffer local_70;
  LogicalType *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  InternalException *in_stack_ffffffffffffffe0;
  
  this = Vector::GetType(in_RDI);
  PVar1 = LogicalType::InternalType(this);
  if (PVar1 != VARCHAR) {
    local_70.aux_data.
    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl._7_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffd8,
               "StringVector::GetStringBuffer - vector is not of internal type VARCHAR but of type %s"
               ,(allocator *)&stack0xffffffffffffffd7);
    Vector::GetType(in_RDI);
    LogicalType::LogicalType((LogicalType *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    InternalException::InternalException<duckdb::LogicalType>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    local_70.aux_data.
    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl._7_1_ = 0;
    __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
  }
  bVar2 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3e4de9);
  if (!bVar2) {
    in_stack_ffffffffffffff70 = &local_70;
    make_buffer<duckdb::VectorStringBuffer>();
    shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorStringBuffer,_0>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    shared_ptr<duckdb::VectorStringBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorStringBuffer,_true> *)0x3e4e1e);
  }
  shared_ptr<duckdb::VectorBuffer,_true>::get((shared_ptr<duckdb::VectorBuffer,_true> *)0x3e4e4b);
  pVVar4 = VectorBuffer::Cast<duckdb::VectorStringBuffer>(in_stack_ffffffffffffff70);
  return pVVar4;
}

Assistant:

VectorStringBuffer &StringVector::GetStringBuffer(Vector &vector) {
	if (vector.GetType().InternalType() != PhysicalType::VARCHAR) {
		throw InternalException("StringVector::GetStringBuffer - vector is not of internal type VARCHAR but of type %s",
		                        vector.GetType());
	}
	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::STRING_BUFFER);
	return vector.auxiliary.get()->Cast<VectorStringBuffer>();
}